

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# errors.c
# Opt level: O2

void err(errtype_t type,char *message,...)

{
  char in_AL;
  undefined8 in_RCX;
  undefined8 in_RDX;
  undefined8 in_R8;
  undefined8 in_R9;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  va_list args;
  __va_list_tag local_e8;
  undefined1 local_c8 [16];
  undefined8 local_b8;
  undefined8 local_b0;
  undefined8 local_a8;
  undefined8 local_a0;
  undefined8 local_98;
  undefined8 local_88;
  undefined8 local_78;
  undefined8 local_68;
  undefined8 local_58;
  undefined8 local_48;
  undefined8 local_38;
  undefined8 local_28;
  
  if (in_AL != '\0') {
    local_98 = in_XMM0_Qa;
    local_88 = in_XMM1_Qa;
    local_78 = in_XMM2_Qa;
    local_68 = in_XMM3_Qa;
    local_58 = in_XMM4_Qa;
    local_48 = in_XMM5_Qa;
    local_38 = in_XMM6_Qa;
    local_28 = in_XMM7_Qa;
  }
  if (((eline != last_line) || (ecolumn != last_col)) || (last_lvl < (int)type)) {
    local_b8 = in_RDX;
    local_b0 = in_RCX;
    local_a8 = in_R8;
    local_a0 = in_R9;
    if (ecolumn < 1 || eline < 1) {
      fprintf(_stderr,"%s: ",efile);
    }
    else {
      fprintf(_stderr,"%s:%d:%d: ",efile);
    }
    local_e8.reg_save_area = local_c8;
    local_e8.overflow_arg_area = &args[0].overflow_arg_area;
    local_e8.gp_offset = 0x10;
    local_e8.fp_offset = 0x30;
    verr(type,message,&local_e8,0);
  }
  return;
}

Assistant:

void err(errtype_t type, const char* message, ...)
{
    va_list args;
#ifdef NDEBUG
    /* The recursive parser can generate a new error at each recursion level */
    if (eline == last_line && ecolumn == last_col && (int)type <= last_lvl)
        return;
#endif


    if (eline > 0 && ecolumn > 0)
        fprintf(stderr, "%s:%d:%d: ", efile, eline, ecolumn);
    else
        fprintf(stderr, "%s: ", efile);
    va_start(args, message);
    verr(type, message, args, 0);
    va_end(args);
}